

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsIis.cpp
# Opt level: O0

void __thiscall HighsIis::invalidate(HighsIis *this)

{
  undefined1 *in_RDI;
  
  *in_RDI = 0;
  *(undefined4 *)(in_RDI + 4) = 0;
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x4cd686);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x4cd694);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x4cd6a2);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x4cd6b0);
  std::vector<HighsIisInfo,_std::allocator<HighsIisInfo>_>::clear
            ((vector<HighsIisInfo,_std::allocator<HighsIisInfo>_> *)0x4cd6be);
  return;
}

Assistant:

void HighsIis::invalidate() {
  this->valid_ = false;
  this->strategy_ = kIisStrategyMin;
  this->col_index_.clear();
  this->row_index_.clear();
  this->col_bound_.clear();
  this->row_bound_.clear();
  this->info_.clear();
}